

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::GetKeyPressedAmount(int key_index,float repeat_delay,float repeat_rate)

{
  float t_00;
  bool local_25;
  float t;
  ImGuiContext *g;
  float repeat_rate_local;
  float repeat_delay_local;
  int key_index_local;
  
  if (key_index < 0) {
    repeat_delay_local = 0.0;
  }
  else {
    local_25 = 0x1ff < (uint)key_index;
    if (local_25) {
      __assert_fail("key_index >= 0 && key_index < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown)))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                    ,0x1136,"int ImGui::GetKeyPressedAmount(int, float, float)");
    }
    t_00 = (GImGui->IO).KeysDownDuration[key_index];
    repeat_delay_local =
         (float)CalcTypematicPressedRepeatAmount
                          (t_00,t_00 - (GImGui->IO).DeltaTime,repeat_delay,repeat_rate);
  }
  return (int)repeat_delay_local;
}

Assistant:

int ImGui::GetKeyPressedAmount(int key_index, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    if (key_index < 0)
        return 0;
    IM_ASSERT(key_index >= 0 && key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[key_index];
    return CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, repeat_delay, repeat_rate);
}